

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int setDateTimeToCurrent(sqlite3_context *context,DateTime *p)

{
  i64 *pTimeOut;
  long lVar1;
  int iVar2;
  
  pTimeOut = &context->pVdbe->iCurrentTime;
  if ((context->pVdbe->iCurrentTime == 0) &&
     (iVar2 = sqlite3OsCurrentTimeInt64(context->pOut->db->pVfs,pTimeOut), iVar2 != 0)) {
    *pTimeOut = 0;
  }
  lVar1 = *pTimeOut;
  p->iJD = lVar1;
  if (lVar1 >= 1) {
    p->validJD = '\x01';
    p->validYMD = '\0';
    p->field_0x2c = p->field_0x2c & 0xe7 | 8;
    p->validHMS = '\0';
    p->tz = 0;
  }
  return (uint)(lVar1 < 1);
}

Assistant:

static int setDateTimeToCurrent(sqlite3_context *context, DateTime *p){
  p->iJD = sqlite3StmtCurrentTime(context);
  if( p->iJD>0 ){
    p->validJD = 1;
    p->isUtc = 1;
    p->isLocal = 0;
    clearYMD_HMS_TZ(p);
    return 0;
  }else{
    return 1;
  }
}